

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Descriptor.cpp
# Opt level: O0

TypeDescriptor * lessThanEqOperator(TypeDescriptor *leftValue,TypeDescriptor *rightValue)

{
  bool bVar1;
  types *ptVar2;
  NumberDescriptor *pNVar3;
  ostream *this;
  double dVar4;
  double dVar5;
  double local_b0;
  string local_80;
  string local_60;
  NumberDescriptor *stringLessEq;
  NumberDescriptor *numLessEq;
  TypeDescriptor *rightValue_local;
  TypeDescriptor *leftValue_local;
  
  numLessEq = (NumberDescriptor *)rightValue;
  rightValue_local = leftValue;
  ptVar2 = TypeDescriptor::type(leftValue);
  if ((*ptVar2 == NUMBER) &&
     (ptVar2 = TypeDescriptor::type(&numLessEq->super_TypeDescriptor), *ptVar2 == NUMBER)) {
    pNVar3 = (NumberDescriptor *)operator_new(0x60);
    dVar4 = TypeDescriptor::getNumber(rightValue_local);
    dVar5 = TypeDescriptor::getNumber(&numLessEq->super_TypeDescriptor);
    NumberDescriptor::NumberDescriptor
              (pNVar3,(double)(-(ulong)(dVar4 <= dVar5) & 0x3ff0000000000000));
    return &pNVar3->super_TypeDescriptor;
  }
  ptVar2 = TypeDescriptor::type(rightValue_local);
  if ((*ptVar2 == STRING) &&
     (ptVar2 = TypeDescriptor::type(&numLessEq->super_TypeDescriptor), *ptVar2 == STRING)) {
    pNVar3 = (NumberDescriptor *)operator_new(0x60);
    TypeDescriptor::getString_abi_cxx11_(&local_60,rightValue_local);
    TypeDescriptor::getString_abi_cxx11_(&local_80,&numLessEq->super_TypeDescriptor);
    bVar1 = std::operator<=(&local_60,&local_80);
    local_b0 = 1.0;
    if (!bVar1) {
      local_b0 = 0.0;
    }
    NumberDescriptor::NumberDescriptor(pNVar3,local_b0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    return &pNVar3->super_TypeDescriptor;
  }
  this = std::operator<<((ostream *)&std::cout,"Unknown type. Terminating...");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  exit(2);
}

Assistant:

TypeDescriptor *lessThanEqOperator(TypeDescriptor *leftValue, TypeDescriptor *rightValue){
    if(leftValue->type() == TypeDescriptor::NUMBER
       && rightValue->type() == TypeDescriptor::NUMBER){
        auto *numLessEq = new  NumberDescriptor(leftValue->getNumber() <= rightValue->getNumber() ? 1.0 : 0.0);
        //std::cout << "TypeDescriptor *lessThanEqOperator: " << leftValue->getNumber() << " <= " << rightValue->getNumber() << std::endl;
        return numLessEq;
    }else if(leftValue->type() == TypeDescriptor::STRING
             && rightValue->type() == TypeDescriptor::STRING ){
        auto *stringLessEq = new  NumberDescriptor(leftValue->getString()  <= rightValue->getString()  ? 1.0 : 0.0);
        //std::cout << "TypeDescriptor *lessThanEqOperator: " << leftValue->getString()  << " <=  " << rightValue->getString()  << std::endl;
        return stringLessEq;
    }else{
        std::cout << "Unknown type. Terminating..." << std::endl;
        exit(2);
    }
}